

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCompleteStep(ARKodeMem ark_mem,realtype dsm)

{
  int iVar1;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  realtype troundoff;
  int mode;
  int retval;
  N_Vector in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  void *arkode_mem;
  
  arkode_mem = (void *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *(double *)(in_RDI + 0x198) = *(double *)(in_RDI + 0x230) + *(double *)(in_RDI + 0x168);
  if ((*(int *)(in_RDI + 0x150) != 0) &&
     (in_stack_ffffffffffffffd8 =
           (N_Vector)
           (*(double *)(in_RDI + 8) * 100.0 *
           (ABS(*(double *)(in_RDI + 0x198)) + ABS(*(double *)(in_RDI + 0x168)))),
     ABS(*(double *)(in_RDI + 0x198) - *(double *)(in_RDI + 0x158)) <=
     (double)in_stack_ffffffffffffffd8)) {
    *(undefined8 *)(in_RDI + 0x198) = *(undefined8 *)(in_RDI + 0x158);
  }
  if (*(long *)(in_RDI + 0x288) != 0) {
    iVar1 = (**(code **)(in_RDI + 0x288))
                      ((int)*(undefined8 *)(in_RDI + 0x198),*(undefined8 *)(in_RDI + 0x108),
                       *(undefined8 *)(in_RDI + 0x290));
    if (iVar1 != 0) {
      return -0x25;
    }
    in_stack_ffffffffffffffe4 = 0;
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    iVar1 = arkInterpUpdate(arkode_mem,
                            (ARKInterp)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                            ,(realtype)in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffe4 = 0;
  }
  if (*(int *)(in_RDI + 0x264) != 0) {
    in_stack_ffffffffffffffe0 = (uint)(*(long *)(in_RDI + 0x288) == 0);
    iVar1 = (**(code **)(in_RDI + 0xd8))
                      ((int)*(undefined8 *)(in_RDI + 0x198),in_RDI,*(undefined8 *)(in_RDI + 0x108),
                       *(undefined8 *)(in_RDI + 0x118),in_stack_ffffffffffffffe0);
    if (iVar1 != 0) {
      return -8;
    }
    in_stack_ffffffffffffffe4 = 0;
  }
  N_VScale((realtype)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8,(N_Vector)0x1160dd2);
  *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x48) =
       *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x40);
  *(double *)(*(long *)(in_RDI + 0x1b0) + 0x40) =
       (double)arkode_mem * *(double *)(*(long *)(in_RDI + 0x1b0) + 0x78);
  *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x58) =
       *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x50);
  *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x50) = *(undefined8 *)(in_RDI + 0x168);
  *(long *)(in_RDI + 0x1d8) = *(long *)(in_RDI + 0x1d8) + 1;
  *(undefined8 *)(in_RDI + 0x238) = *(undefined8 *)(in_RDI + 0x168);
  *(undefined8 *)(in_RDI + 0x230) = *(undefined8 *)(in_RDI + 0x198);
  *(double *)(in_RDI + 0x180) = *(double *)(in_RDI + 0x168) * *(double *)(in_RDI + 400);
  **(undefined8 **)(in_RDI + 0x1b0) = *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x80);
  *(undefined4 *)(in_RDI + 0x254) = 0;
  *(undefined4 *)(in_RDI + 0x25c) = 0;
  return 0;
}

Assistant:

int arkCompleteStep(ARKodeMem ark_mem, realtype dsm)
{
  int retval, mode;
  realtype troundoff;

  /* Set current time to the end of the step (in case the last
     stage time does not coincide with the step solution time).
     If tstop is enabled, it is possible for tn + h to be past
     tstop by roundoff, and in that case, we reset tn (after
     incrementing by h) to tstop. */
  ark_mem->tcur = ark_mem->tn + ark_mem->h;
  if ( ark_mem->tstopset ) {
    troundoff = FUZZ_FACTOR * ark_mem->uround *
      (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
    if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
      ark_mem->tcur = ark_mem->tstop;
  }

#ifdef SUNDIALS_DEBUG
  printf("ARKODE end step %li,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

  /* apply user-supplied step postprocessing function (if supplied) */
  if (ark_mem->ProcessStep != NULL) {
    retval = ark_mem->ProcessStep(ark_mem->tcur,
                                  ark_mem->ycur,
                                  ark_mem->ps_data);
    if (retval != 0) return(ARK_POSTPROCESS_STEP_FAIL);
  }

  /* update interpolation structure */
  if (ark_mem->interp != NULL) {
    retval = arkInterpUpdate(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != ARK_SUCCESS)  return(retval);
  }

  /* call fullrhs if needed */
  if (ark_mem->call_fullrhs) {
    mode = (ark_mem->ProcessStep != NULL) ? ARK_FULLRHS_START : ARK_FULLRHS_END;
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->ycur,
                                   ark_mem->fn, mode);
    if (retval != 0) return(ARK_RHSFUNC_FAIL);
  }

  /* update yn to current solution */
  N_VScale(ONE, ark_mem->ycur, ark_mem->yn);

  /* Update step size and error history arrays */
  ark_mem->hadapt_mem->ehist[1] = ark_mem->hadapt_mem->ehist[0];
  ark_mem->hadapt_mem->ehist[0] = dsm*ark_mem->hadapt_mem->bias;
  ark_mem->hadapt_mem->hhist[1] = ark_mem->hadapt_mem->hhist[0];
  ark_mem->hadapt_mem->hhist[0] = ark_mem->h;

  /* update scalar quantities */
  ark_mem->nst++;
  ark_mem->hold   = ark_mem->h;
  ark_mem->tn     = ark_mem->tcur;
  ark_mem->hprime = ark_mem->h * ark_mem->eta;

  /* Reset growth factor for subsequent time step */
  ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;

  /* Turn off flag indicating initial step and first stage */
  ark_mem->initsetup  = SUNFALSE;
  ark_mem->firststage = SUNFALSE;

  return(ARK_SUCCESS);
}